

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall flatbuffers::Parser::Deserialize(Parser *this,uint8_t *buf,size_t size)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  code *pcVar4;
  Verifier verifier;
  
  VerifierTemplate<false>::VerifierTemplate(&verifier,buf,size,0x40,1000000,true);
  bVar1 = reflection::SchemaBufferHasIdentifier(buf);
  if (bVar1) {
    pcVar4 = reflection::VerifySchemaBuffer;
  }
  else {
    bVar2 = BufferHasIdentifier(buf,"BFBS",true);
    if (!bVar2) {
      return false;
    }
    pcVar4 = reflection::VerifySizePrefixedSchemaBuffer;
  }
  cVar3 = (*pcVar4)(&verifier);
  if (cVar3 == '\0') {
    return false;
  }
  if (!bVar1) {
    buf = buf + 4;
  }
  bVar1 = Deserialize(this,(Schema *)((ulong)*(uint *)buf + (long)buf));
  return bVar1;
}

Assistant:

bool Parser::Deserialize(const uint8_t *buf, const size_t size) {
  flatbuffers::Verifier verifier(reinterpret_cast<const uint8_t *>(buf), size);
  bool size_prefixed = false;
  if (!reflection::SchemaBufferHasIdentifier(buf)) {
    if (!flatbuffers::BufferHasIdentifier(buf, reflection::SchemaIdentifier(),
                                          true))
      return false;
    else
      size_prefixed = true;
  }
  auto verify_fn = size_prefixed ? &reflection::VerifySizePrefixedSchemaBuffer
                                 : &reflection::VerifySchemaBuffer;
  if (!verify_fn(verifier)) { return false; }
  auto schema = size_prefixed ? reflection::GetSizePrefixedSchema(buf)
                              : reflection::GetSchema(buf);
  return Deserialize(schema);
}